

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledYa.cpp
# Opt level: O2

void anon_unknown.dwarf_27986c::waves(Array2D<Imf_2_5::Rgba> *pixels,int w,int h)

{
  unsigned_short uVar1;
  Rgba *pRVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  int x;
  ulong uVar12;
  long local_88;
  
  uVar11 = (ulong)(uint)w;
  if (w < 1) {
    uVar11 = 0;
  }
  local_88 = 0;
  uVar8 = (ulong)(uint)h;
  if (h < 1) {
    uVar8 = 0;
  }
  for (uVar7 = 0; uVar7 != uVar8; uVar7 = uVar7 + 1) {
    dVar3 = (double)(int)uVar7;
    lVar9 = 6;
    for (uVar12 = 0; uVar11 != uVar12; uVar12 = uVar12 + 1) {
      lVar10 = pixels->_sizeY * local_88;
      pRVar2 = pixels->_data;
      dVar4 = (double)(int)uVar12;
      dVar5 = sin(dVar4 * 0.1 + dVar3 * 0.1);
      dVar6 = sin(dVar4 * -0.1 + dVar3 * 0.2);
      half::operator=((half *)((long)pRVar2 + lVar9 + lVar10 + -6),
                      (float)(dVar6 * 0.5 + 0.5 + dVar5 * 0.5 + 0.5));
      uVar1 = *(unsigned_short *)((long)&pRVar2[uVar12].r._h + lVar10);
      *(unsigned_short *)((long)&pRVar2[uVar12].g._h + lVar10) = uVar1;
      *(unsigned_short *)((long)&pRVar2[uVar12].b._h + lVar10) = uVar1;
      dVar4 = sin(dVar4 * 1.1 + dVar3 * 0.5);
      half::operator=((half *)((long)&(pRVar2->r)._h + lVar9 + lVar10),(float)(dVar4 * 0.5 + 0.5));
      lVar9 = lVar9 + 8;
    }
    local_88 = local_88 + 8;
  }
  return;
}

Assistant:

void
waves (Array2D<Rgba> &pixels, int w, int h)
{
    for (int y = 0; y < h; ++y)
    {
	for (int x = 0; x < w; ++x)
	{
	    Rgba &p = pixels[y][x];

	    p.r = (0.5 + 0.5 * sin (0.1 * x + 0.1 * y)) +
		  (0.5 + 0.5 * sin (-0.1 * x + 0.2 * y));

	    p.g = p.r;
	    p.b = p.r;

	    p.a = (0.5 + 0.5 * sin (1.1 * x + 0.5 * y));
	}
    }
}